

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsNormalDefinitionSet(cmMakefile *this,string *name)

{
  bool bVar1;
  cmVariableWatch *this_00;
  cmVariableWatch *vv;
  cmValue def;
  string *name_local;
  cmMakefile *this_local;
  
  def.Value = name;
  vv = (cmVariableWatch *)cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  this_00 = GetVariableWatch(this);
  if ((this_00 != (cmVariableWatch *)0x0) &&
     (bVar1 = cmValue::operator_cast_to_bool((cmValue *)&vv), !bVar1)) {
    cmVariableWatch::VariableAccessed(this_00,def.Value,2,(char *)0x0,this);
  }
  bVar1 = ::operator!=((cmValue)vv,(nullptr_t)0x0);
  return bVar1;
}

Assistant:

bool cmMakefile::IsNormalDefinitionSet(const std::string& name) const
{
  cmValue def = this->StateSnapshot.GetDefinition(name);
#ifndef CMAKE_BOOTSTRAP
  if (cmVariableWatch* vv = this->GetVariableWatch()) {
    if (!def) {
      vv->VariableAccessed(
        name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS, nullptr, this);
    }
  }
#endif
  return def != nullptr;
}